

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataControllerDefault.cpp
# Opt level: O3

void __thiscall Rml::DataControllerValue::ProcessEvent(DataControllerValue *this,Event *event)

{
  bool bVar1;
  Element *this_00;
  Dictionary *this_01;
  const_iterator cVar2;
  const_iterator cVar3;
  DataModel *this_02;
  const_iterator cVar4;
  DataVariable variable;
  Variant value_to_set;
  String local_68;
  Variant local_48;
  
  this_00 = DataController::GetElement(&this->super_DataController);
  if (this_00 != (Element *)0x0) {
    Variant::Variant(&local_48);
    this_01 = Event::GetParameters_abi_cxx11_(event);
    cVar2 = itlib::
            flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
            ::find<char[28]>(this_01,(char (*) [28])"data-binding-override-value");
    cVar3 = itlib::
            flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
            ::find<char[6]>(this_01,(char (*) [6])0x2d0239);
    cVar4 = cVar2;
    if ((cVar2._M_current ==
         (this_01->m_container).
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       (cVar4 = cVar3, cVar3._M_current == cVar2._M_current)) {
      Element::GetAddress_abi_cxx11_(&local_68,this_00,false,true);
      Log::Message(LT_WARNING,
                   "A \'change\' event was received, but it did not contain the attribute \'value\' when processing a data binding in %s"
                   ,local_68._M_dataplus._M_p);
      if ((DataVariable *)local_68._M_dataplus._M_p != (DataVariable *)&local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      Variant::operator=(&local_48,&(cVar4._M_current)->second);
    }
    this_02 = Element::GetDataModel(this_00);
    if ((this_02 != (DataModel *)0x0) && (local_48.type != NONE)) {
      local_68._0_16_ = DataModel::GetVariable(this_02,&this->address);
      if (local_68._M_dataplus._M_p != (VariableDefinition *)0x0) {
        bVar1 = DataVariable::Set((DataVariable *)&local_68,&local_48);
        if (bVar1) {
          DataModel::DirtyVariable
                    (this_02,&((this->address).
                               super__Vector_base<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                               ._M_impl.super__Vector_impl_data._M_start)->name);
        }
      }
    }
    Variant::~Variant(&local_48);
  }
  return;
}

Assistant:

void DataControllerValue::ProcessEvent(Event& event)
{
	if (const Element* element = GetElement())
	{
		Variant value_to_set;
		const auto& parameters = event.GetParameters();
		const auto override_value_it = parameters.find("data-binding-override-value");
		const auto value_it = parameters.find("value");
		if (override_value_it != parameters.cend())
			value_to_set = override_value_it->second;
		else if (value_it != parameters.cend())
			value_to_set = value_it->second;
		else
			Log::Message(Log::LT_WARNING,
				"A 'change' event was received, but it did not contain the attribute 'value' when processing a data binding in %s",
				element->GetAddress().c_str());

		DataModel* model = element->GetDataModel();
		if (value_to_set.GetType() == Variant::NONE || !model)
			return;

		if (DataVariable variable = model->GetVariable(address))
			if (variable.Set(value_to_set))
				model->DirtyVariable(address.front().name);
	}
}